

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

string __thiscall mjs::to_string(mjs *this,gc_heap *h,double m)

{
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  string sVar2;
  wstring local_48;
  wstring_view local_28;
  
  number_to_string_abi_cxx11_(&local_48,(mjs *)h,m);
  local_28._M_len = local_48._M_string_length;
  local_28._M_str = local_48._M_dataplus._M_p;
  string::string((string *)this,h,&local_28);
  uVar1 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 4 + 4);
    uVar1 = extraout_RDX_00;
  }
  sVar2.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = uVar1;
  sVar2.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar2.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string to_string(gc_heap& h, double m) {
    return string{h, number_to_string(m)};
}